

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse_time.c
# Opt level: O0

time_t ngx_parse_http_time(u_char *value,size_t len)

{
  u_char *puVar1;
  ngx_uint_t nVar2;
  int iVar3;
  u_char *puVar4;
  u_char *puVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int local_7c;
  int local_6c;
  anon_enum_32 fmt;
  uint64_t time;
  ngx_uint_t sec;
  ngx_uint_t min;
  ngx_uint_t hour;
  ngx_uint_t year;
  ngx_uint_t day;
  ngx_int_t month;
  u_char *end;
  u_char *p;
  size_t len_local;
  u_char *value_local;
  
  local_6c = 0;
  puVar4 = value + len;
  year = 0x20;
  hour = 0x7f6;
  end = value;
  while( true ) {
    if ((puVar4 <= end) || (*end == ',')) goto LAB_0011f374;
    if (*end == ' ') break;
    end = end + 1;
  }
  local_6c = 3;
LAB_0011f374:
  do {
    puVar1 = end;
    end = puVar1 + 1;
    if (puVar4 <= end) break;
  } while (*end == ' ');
  if ((long)puVar4 - (long)end < 0x12) {
    value_local = (u_char *)0xffffffffffffffff;
  }
  else {
    if (local_6c != 3) {
      if ((((*end < 0x30) || (0x39 < *end)) || (puVar1[2] < 0x30)) || (0x39 < puVar1[2])) {
        return -1;
      }
      year = (ngx_uint_t)(int)((*end - 0x30) * 10 + (uint)puVar1[2] + -0x30);
      puVar5 = puVar1 + 3;
      if (*puVar5 == ' ') {
        if ((long)puVar4 - (long)puVar5 < 0x12) {
          return -1;
        }
        local_6c = 1;
      }
      else {
        if (*puVar5 != '-') {
          return -1;
        }
        local_6c = 2;
      }
      end = puVar1 + 4;
    }
    switch(*end) {
    case 'A':
      iVar3 = 7;
      if (end[1] == 'p') {
        iVar3 = 3;
      }
      day = (ngx_uint_t)iVar3;
      break;
    default:
      return -1;
    case 'D':
      day = 0xb;
      break;
    case 'F':
      day = 1;
      break;
    case 'J':
      if (end[1] == 'a') {
        local_7c = 0;
      }
      else {
        local_7c = 6;
        if (end[2] == 'n') {
          local_7c = 5;
        }
      }
      day = (ngx_uint_t)local_7c;
      break;
    case 'M':
      iVar3 = 4;
      if (end[2] == 'r') {
        iVar3 = 2;
      }
      day = (ngx_uint_t)iVar3;
      break;
    case 'N':
      day = 10;
      break;
    case 'O':
      day = 9;
      break;
    case 'S':
      day = 8;
    }
    if (((local_6c == 1) && (end[3] != ' ')) || ((local_6c == 2 && (end[3] != '-')))) {
      value_local = (u_char *)0xffffffffffffffff;
    }
    else {
      pbVar6 = end + 4;
      if (local_6c == 1) {
        if ((((*pbVar6 < 0x30) || (0x39 < *pbVar6)) || (end[5] < 0x30)) ||
           (((0x39 < end[5] || (end[6] < 0x30)) ||
            ((0x39 < end[6] || ((end[7] < 0x30 || (0x39 < end[7])))))))) {
          return -1;
        }
        hour = (ngx_uint_t)
               (int)((*pbVar6 - 0x30) * 1000 + (end[5] - 0x30) * 100 + (end[6] - 0x30) * 10 +
                     (uint)end[7] + -0x30);
        pbVar6 = end + 8;
      }
      else if (local_6c == 2) {
        if (((*pbVar6 < 0x30) || (0x39 < *pbVar6)) || ((end[5] < 0x30 || (0x39 < end[5])))) {
          return -1;
        }
        uVar7 = (ulong)(int)((*pbVar6 - 0x30) * 10 + (uint)end[5] + -0x30);
        iVar3 = 0x76c;
        if (uVar7 < 0x46) {
          iVar3 = 2000;
        }
        hour = (long)iVar3 + uVar7;
        pbVar6 = end + 6;
      }
      end = pbVar6;
      if (local_6c == 3) {
        if (*end == ' ') {
          end = end + 1;
        }
        if ((*end < 0x30) || (0x39 < *end)) {
          return -1;
        }
        pbVar6 = end + 1;
        year = (ngx_uint_t)(int)(*end - 0x30);
        if (*pbVar6 != 0x20) {
          if ((*pbVar6 < 0x30) || (0x39 < *pbVar6)) {
            return -1;
          }
          year = (year * 10 + (ulong)*pbVar6) - 0x30;
          pbVar6 = end + 2;
        }
        end = pbVar6;
        if ((long)puVar4 - (long)end < 0xe) {
          return -1;
        }
      }
      pbVar6 = end + 1;
      if (*end == ' ') {
        if ((((*pbVar6 < 0x30) || (0x39 < *pbVar6)) || (end[2] < 0x30)) || (0x39 < end[2])) {
          value_local = (u_char *)0xffffffffffffffff;
        }
        else {
          uVar7 = (ulong)(int)((*pbVar6 - 0x30) * 10 + (uint)end[2] + -0x30);
          pbVar6 = end + 4;
          if (end[3] == ':') {
            if (((*pbVar6 < 0x30) || (0x39 < *pbVar6)) || ((end[5] < 0x30 || (0x39 < end[5])))) {
              value_local = (u_char *)0xffffffffffffffff;
            }
            else {
              uVar8 = (ulong)(int)((*pbVar6 - 0x30) * 10 + (uint)end[5] + -0x30);
              pbVar6 = end + 7;
              if (end[6] == ':') {
                if (((*pbVar6 < 0x30) || (0x39 < *pbVar6)) || ((end[8] < 0x30 || (0x39 < end[8]))))
                {
                  value_local = (u_char *)0xffffffffffffffff;
                }
                else {
                  uVar9 = (ulong)(int)((*pbVar6 - 0x30) * 10 + (uint)end[8] + -0x30);
                  if (local_6c == 3) {
                    pbVar6 = end + 10;
                    if (end[9] != ' ') {
                      return -1;
                    }
                    if ((((((*pbVar6 < 0x30) || (0x39 < *pbVar6)) || (end[0xb] < 0x30)) ||
                         ((0x39 < end[0xb] || (end[0xc] < 0x30)))) || (0x39 < end[0xc])) ||
                       ((end[0xd] < 0x30 || (0x39 < end[0xd])))) {
                      return -1;
                    }
                    hour = (ngx_uint_t)
                           (int)((*pbVar6 - 0x30) * 1000 + (end[0xb] - 0x30) * 100 +
                                 (end[0xc] - 0x30) * 10 + (uint)end[0xd] + -0x30);
                  }
                  if (((uVar7 < 0x18) && (uVar8 < 0x3c)) && (uVar9 < 0x3c)) {
                    if ((year == 0x1d) && (day == 1)) {
                      if (((hour & 3) != 0) || ((hour % 100 == 0 && (hour % 400 != 0)))) {
                        return -1;
                      }
                    }
                    else if (mday[day] < year) {
                      return -1;
                    }
                    nVar2 = day - 1;
                    if ((long)(day - 1) < 1) {
                      hour = hour - 1;
                      nVar2 = day + 0xb;
                    }
                    day = nVar2;
                    value_local = (u_char *)
                                  ((((hour * 0x16d + (hour >> 2)) - hour / 100) + hour / 400 +
                                    (long)(day * 0x16f) / 0xc + year + -0xafa8b) * 0x15180 +
                                   uVar7 * 0xe10 + uVar8 * 0x3c + uVar9);
                  }
                  else {
                    value_local = (u_char *)0xffffffffffffffff;
                  }
                }
              }
              else {
                value_local = (u_char *)0xffffffffffffffff;
              }
            }
          }
          else {
            value_local = (u_char *)0xffffffffffffffff;
          }
        }
      }
      else {
        value_local = (u_char *)0xffffffffffffffff;
      }
    }
  }
  return (time_t)value_local;
}

Assistant:

time_t
ngx_parse_http_time(u_char *value, size_t len)
{
    u_char      *p, *end;
    ngx_int_t    month;
    ngx_uint_t   day, year, hour, min, sec;
    uint64_t     time;
    enum {
        no = 0,
        rfc822,   /* Tue, 10 Nov 2002 23:50:13   */
        rfc850,   /* Tuesday, 10-Dec-02 23:50:13 */
        isoc      /* Tue Dec 10 23:50:13 2002    */
    } fmt;

    fmt = 0;
    end = value + len;

#if (NGX_SUPPRESS_WARN)
    day = 32;
    year = 2038;
#endif

    for (p = value; p < end; p++) {
        if (*p == ',') {
            break;
        }

        if (*p == ' ') {
            fmt = isoc;
            break;
        }
    }

    for (p++; p < end; p++)
        if (*p != ' ') {
            break;
        }

    if (end - p < 18) {
        return NGX_ERROR;
        }

    if (fmt != isoc) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        day = (*p - '0') * 10 + *(p + 1) - '0';
        p += 2;

        if (*p == ' ') {
            if (end - p < 18) {
                return NGX_ERROR;
            }
            fmt = rfc822;

        } else if (*p == '-') {
            fmt = rfc850;

        } else {
            return NGX_ERROR;
        }

        p++;
    }

    switch (*p) {

    case 'J':
        month = *(p + 1) == 'a' ? 0 : *(p + 2) == 'n' ? 5 : 6;
        break;

    case 'F':
        month = 1;
        break;

    case 'M':
        month = *(p + 2) == 'r' ? 2 : 4;
        break;

    case 'A':
        month = *(p + 1) == 'p' ? 3 : 7;
        break;

    case 'S':
        month = 8;
        break;

    case 'O':
        month = 9;
        break;

    case 'N':
        month = 10;
        break;

    case 'D':
        month = 11;
        break;

    default:
        return NGX_ERROR;
    }

    p += 3;

    if ((fmt == rfc822 && *p != ' ') || (fmt == rfc850 && *p != '-')) {
        return NGX_ERROR;
    }

    p++;

    if (fmt == rfc822) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
        p += 4;

    } else if (fmt == rfc850) {
        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
            return NGX_ERROR;
        }

        year = (*p - '0') * 10 + *(p + 1) - '0';
        year += (year < 70) ? 2000 : 1900;
        p += 2;
    }

    if (fmt == isoc) {
        if (*p == ' ') {
            p++;
        }

        if (*p < '0' || *p > '9') {
            return NGX_ERROR;
        }

        day = *p++ - '0';

        if (*p != ' ') {
            if (*p < '0' || *p > '9') {
                return NGX_ERROR;
            }

            day = day * 10 + *p++ - '0';
        }

        if (end - p < 14) {
            return NGX_ERROR;
        }
    }

    if (*p++ != ' ') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    hour = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    min = (*p - '0') * 10 + *(p + 1) - '0';
    p += 2;

    if (*p++ != ':') {
        return NGX_ERROR;
    }

    if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9') {
        return NGX_ERROR;
    }

    sec = (*p - '0') * 10 + *(p + 1) - '0';

    if (fmt == isoc) {
        p += 2;

        if (*p++ != ' ') {
            return NGX_ERROR;
        }

        if (*p < '0' || *p > '9' || *(p + 1) < '0' || *(p + 1) > '9'
            || *(p + 2) < '0' || *(p + 2) > '9'
            || *(p + 3) < '0' || *(p + 3) > '9')
        {
            return NGX_ERROR;
        }

        year = (*p - '0') * 1000 + (*(p + 1) - '0') * 100
               + (*(p + 2) - '0') * 10 + *(p + 3) - '0';
    }

    if (hour > 23 || min > 59 || sec > 59) {
        return NGX_ERROR;
    }

    if (day == 29 && month == 1) {
        if ((year & 3) || ((year % 100 == 0) && (year % 400) != 0)) {
            return NGX_ERROR;
        }

    } else if (day > mday[month]) {
        return NGX_ERROR;
    }

    /*
     * shift new year to March 1 and start months from 1 (not 0),
     * it is needed for Gauss' formula
     */

    if (--month <= 0) {
        month += 12;
        year -= 1;
    }

    /* Gauss' formula for Gregorian days since March 1, 1 BC */

    time = (uint64_t) (
            /* days in years including leap years since March 1, 1 BC */

            365 * year + year / 4 - year / 100 + year / 400

            /* days before the month */

            + 367 * month / 12 - 30

            /* days before the day */

            + day - 1

            /*
             * 719527 days were between March 1, 1 BC and March 1, 1970,
             * 31 and 28 days were in January and February 1970
             */

            - 719527 + 31 + 28) * 86400 + hour * 3600 + min * 60 + sec;

#if (NGX_TIME_T_SIZE <= 4)

    if (time > 0x7fffffff) {
        return NGX_ERROR;
    }

#endif

    return (time_t) time;
}